

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

char * __thiscall
sentencepiece::SentencePieceText_SentencePiece::_InternalParse
          (SentencePieceText_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  string *s;
  uint32 uVar3;
  char cVar4;
  uint res;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  ArenaStringPtr *pAVar6;
  uint uVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  byte *local_58;
  InternalMetadata *local_50;
  ExtensionSet *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_38 = &this->surface_;
  local_40 = &this->piece_;
  local_50 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = &this->_extensions_;
  uVar7 = 0;
  local_58 = (byte *)ptr;
  do {
    bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    if (bVar2) goto LAB_001b0cdf;
    bVar1 = *local_58;
    res = (uint)bVar1;
    p = local_58 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_58,res);
        p = (byte *)pVar8.first;
        res = pVar8.second;
      }
      else {
        p = local_58 + 2;
      }
    }
    local_58 = p;
    if (p == (byte *)0x0) {
      cVar4 = '\x04';
    }
    else {
      cVar4 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar4 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pvVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar6 = local_40;
        if (((ulong)pvVar5 & 1) != 0) {
          pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
LAB_001b0b27:
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar6,pvVar5);
        local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_58,ctx);
        goto LAB_001b0b3b;
      case 2:
        if (cVar4 == '\x10') {
          bVar1 = *p;
          pVar10.second._0_1_ = bVar1;
          pVar10.first = (char *)p;
          pVar10._9_7_ = 0;
          local_58 = p + 1;
          if ((char)bVar1 < '\0') {
            uVar3 = ((uint)bVar1 + (uint)*local_58 * 0x80) - 0x80;
            if ((char)*local_58 < '\0') {
              local_58 = p;
              pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar3);
              local_58 = (byte *)pVar10.first;
            }
            else {
              local_58 = p + 2;
              pVar10.second = uVar3;
              pVar10.first = (char *)local_58;
              pVar10._12_4_ = 0;
            }
          }
          uVar7 = uVar7 | 4;
          this->id_ = pVar10.second;
LAB_001b0c87:
          cVar4 = (local_58 == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_001b0c96;
        }
        break;
      case 3:
        if (cVar4 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pvVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar6 = local_38;
          if (((ulong)pvVar5 & 1) != 0) {
            pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          goto LAB_001b0b27;
        }
        break;
      case 4:
        if (cVar4 == ' ') {
          bVar1 = *p;
          pVar9.second._0_1_ = bVar1;
          pVar9.first = (char *)p;
          pVar9._9_7_ = 0;
          local_58 = p + 1;
          if ((char)bVar1 < '\0') {
            uVar3 = ((uint)bVar1 + (uint)*local_58 * 0x80) - 0x80;
            if ((char)*local_58 < '\0') {
              local_58 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar3);
              local_58 = (byte *)pVar9.first;
            }
            else {
              local_58 = p + 2;
              pVar9.second = uVar3;
              pVar9.first = (char *)local_58;
              pVar9._12_4_ = 0;
            }
          }
          uVar7 = uVar7 | 8;
          this->begin_ = pVar9.second;
          goto LAB_001b0c87;
        }
        break;
      case 5:
        if (cVar4 == '(') {
          bVar1 = *p;
          pVar8.second._0_1_ = bVar1;
          pVar8.first = (char *)p;
          pVar8._9_7_ = 0;
          local_58 = p + 1;
          if ((char)bVar1 < '\0') {
            uVar3 = ((uint)bVar1 + (uint)*local_58 * 0x80) - 0x80;
            if ((char)*local_58 < '\0') {
              local_58 = p;
              pVar8 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar3);
              local_58 = (byte *)pVar8.first;
            }
            else {
              local_58 = p + 2;
              pVar8.second = uVar3;
              pVar8.first = (char *)local_58;
              pVar8._12_4_ = 0;
            }
          }
          uVar7 = uVar7 | 0x10;
          this->end_ = pVar8.second;
          goto LAB_001b0c87;
        }
      }
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar4 = '\a';
      }
      else {
        if (res < 0x640) {
          if (((ulong)local_50->ptr_ & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(local_50);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (((ulong)local_50->ptr_ & 0xfffffffffffffffe) + 8);
          }
          local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (res,unknown,(char *)local_58,ctx);
        }
        else {
          local_58 = (byte *)google::protobuf::internal::ExtensionSet::ParseField
                                       (local_48,(ulong)res,(char *)p,
                                        (MessageLite *)
                                        _SentencePieceText_SentencePiece_default_instance_,local_50,
                                        ctx);
        }
LAB_001b0b3b:
        cVar4 = (local_58 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_001b0c96:
  } while (cVar4 == '\x02');
  if (cVar4 == '\x04') {
    local_58 = (byte *)0x0;
  }
LAB_001b0cdf:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar7;
  return (char *)local_58;
}

Assistant:

const char* SentencePieceText_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string surface = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_surface();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 begin = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 end = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}